

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O0

void __thiscall
jrtplib::
RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
::~RTPKeyHashTable(RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
                   *this)

{
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  *this_local;
  
  ~RTPKeyHashTable(this);
  operator_delete(this,0x10418);
  return;
}

Assistant:

~RTPKeyHashTable()					{ Clear(); }